

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O0

void archive_entry_xattr_add_entry(archive_entry *entry,char *name,void *value,size_t size)

{
  ae_xattr *paVar1;
  char *pcVar2;
  void *pvVar3;
  ae_xattr *local_30;
  ae_xattr *xp;
  size_t size_local;
  void *value_local;
  char *name_local;
  archive_entry *entry_local;
  
  for (local_30 = entry->xattr_head; local_30 != (ae_xattr *)0x0; local_30 = local_30->next) {
  }
  paVar1 = (ae_xattr *)malloc(0x20);
  if (paVar1 != (ae_xattr *)0x0) {
    pcVar2 = strdup(name);
    paVar1->name = pcVar2;
    pvVar3 = malloc(size);
    paVar1->value = pvVar3;
    if (pvVar3 == (void *)0x0) {
      paVar1->size = 0;
    }
    else {
      memcpy(paVar1->value,value,size);
      paVar1->size = size;
    }
    paVar1->next = entry->xattr_head;
    entry->xattr_head = paVar1;
  }
  return;
}

Assistant:

void
archive_entry_xattr_add_entry(struct archive_entry *entry,
	const char *name, const void *value, size_t size)
{
	struct ae_xattr	*xp;

	for (xp = entry->xattr_head; xp != NULL; xp = xp->next)
		;

	if ((xp = (struct ae_xattr *)malloc(sizeof(struct ae_xattr))) == NULL)
		/* XXX Error XXX */
		return;

	xp->name = strdup(name);
	if ((xp->value = malloc(size)) != NULL) {
		memcpy(xp->value, value, size);
		xp->size = size;
	} else
		xp->size = 0;

	xp->next = entry->xattr_head;
	entry->xattr_head = xp;
}